

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rk_list.cpp
# Opt level: O3

RK_S32 __thiscall rk_list::del_at_head(rk_list *this,void *data,RK_S32 size)

{
  rk_list_node *__ptr;
  rk_list_node *prVar1;
  rk_list_node *prVar2;
  RK_S32 RVar3;
  
  pthread_mutex_lock((pthread_mutex_t *)this);
  RVar3 = -0x16;
  if ((this->head != (rk_list_node *)0x0) && (this->count != 0)) {
    __ptr = this->head->next;
    prVar1 = __ptr->prev;
    prVar2 = __ptr->next;
    prVar2->prev = prVar1;
    prVar1->next = prVar2;
    __ptr->next = __ptr;
    __ptr->prev = __ptr;
    if (__ptr->size != size) {
      _mpp_log_l(2,0,"node size check failed when release_list",0);
      if (__ptr->size < size) {
        size = __ptr->size;
      }
    }
    memcpy(data,__ptr + 1,(long)size);
    free(__ptr);
    this->count = this->count + -1;
    RVar3 = 0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return RVar3;
}

Assistant:

RK_S32 rk_list::del_at_head(void *data, RK_S32 size)
{
    RK_S32 ret = -EINVAL;
    pthread_mutex_lock(&mutex);
    if (head && count) {
        _list_del_node_no_lock(head->next, data, size);
        count--;
        ret = 0;
    }
    pthread_mutex_unlock(&mutex);
    return ret;
}